

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.cpp
# Opt level: O2

void anon_unknown.dwarf_9c21::update_manifest(Manifest *manifest,Target *target,xml_node node)

{
  bool bVar1;
  xml_node *pxVar2;
  char_t *pcVar3;
  string *__rhs;
  xml_node child;
  xml_node rn;
  xml_node local_120;
  xml_attribute local_118;
  xml_node local_110;
  xml_object_range<pugi::xml_named_node_iterator> local_108;
  xml_named_node_iterator local_e8;
  xml_named_node_iterator local_d8;
  set<wire::string,_std::less<wire::string>,_std::allocator<wire::string>_> *local_c8;
  set<wire::string,_std::less<wire::string>,_std::allocator<wire::string>_> *local_c0;
  set<wire::string,_std::less<wire::string>,_std::allocator<wire::string>_> *local_b8;
  xml_node local_b0;
  xml_named_node_iterator local_a8;
  xml_named_node_iterator local_98;
  Target *local_88;
  xml_node local_80;
  string local_78 [32];
  xml_object_range<pugi::xml_named_node_iterator> local_58;
  
  local_88 = target;
  local_80._root = node._root;
  pugi::xml_node::children(&local_58,&local_80,"require");
  local_a8._node._root = local_58._begin._node._root;
  local_a8._name = local_58._begin._name;
  local_98._node._root = local_58._end._node._root;
  local_98._name = local_58._end._name;
  local_b8 = &manifest->types;
  local_c0 = &manifest->enums;
  local_c8 = &manifest->commands;
  while( true ) {
    bVar1 = pugi::xml_named_node_iterator::operator!=(&local_a8,&local_98);
    if (!bVar1) break;
    pxVar2 = pugi::xml_named_node_iterator::operator*(&local_a8);
    local_110._root = pxVar2->_root;
    pugi::xml_node::children(&local_108,&local_110,"type");
    local_d8._node._root = local_108._begin._node._root;
    local_d8._name = local_108._begin._name;
    local_e8._node._root = local_108._end._node._root;
    local_e8._name = local_108._end._name;
    while( true ) {
      bVar1 = pugi::xml_named_node_iterator::operator!=(&local_d8,&local_e8);
      if (!bVar1) break;
      pxVar2 = pugi::xml_named_node_iterator::operator*(&local_d8);
      local_120._root = pxVar2->_root;
      local_118 = pugi::xml_node::attribute(&local_120,"name");
      pcVar3 = pugi::xml_attribute::value(&local_118);
      wire::string::string((string *)local_78,pcVar3);
      std::
      _Rb_tree<wire::string,_wire::string,_std::_Identity<wire::string>,_std::less<wire::string>,_std::allocator<wire::string>_>
      ::_M_insert_unique<wire::string>(&local_b8->_M_t,(string *)local_78);
      std::__cxx11::string::~string(local_78);
      pugi::xml_named_node_iterator::operator++(&local_d8);
    }
    pugi::xml_node::children(&local_108,&local_110,"enum");
    local_d8._node._root = local_108._begin._node._root;
    local_d8._name = local_108._begin._name;
    local_e8._node._root = local_108._end._node._root;
    local_e8._name = local_108._end._name;
    while( true ) {
      bVar1 = pugi::xml_named_node_iterator::operator!=(&local_d8,&local_e8);
      if (!bVar1) break;
      pxVar2 = pugi::xml_named_node_iterator::operator*(&local_d8);
      local_120._root = pxVar2->_root;
      local_118 = pugi::xml_node::attribute(&local_120,"name");
      pcVar3 = pugi::xml_attribute::value(&local_118);
      wire::string::string((string *)local_78,pcVar3);
      std::
      _Rb_tree<wire::string,_wire::string,_std::_Identity<wire::string>,_std::less<wire::string>,_std::allocator<wire::string>_>
      ::_M_insert_unique<wire::string>(&local_c0->_M_t,(string *)local_78);
      std::__cxx11::string::~string(local_78);
      pugi::xml_named_node_iterator::operator++(&local_d8);
    }
    pugi::xml_node::children(&local_108,&local_110,"command");
    local_d8._node._root = local_108._begin._node._root;
    local_d8._name = local_108._begin._name;
    local_e8._node._root = local_108._end._node._root;
    local_e8._name = local_108._end._name;
    while( true ) {
      bVar1 = pugi::xml_named_node_iterator::operator!=(&local_d8,&local_e8);
      if (!bVar1) break;
      pxVar2 = pugi::xml_named_node_iterator::operator*(&local_d8);
      local_120._root = pxVar2->_root;
      local_118 = pugi::xml_node::attribute(&local_120,"name");
      pcVar3 = pugi::xml_attribute::value(&local_118);
      wire::string::string((string *)local_78,pcVar3);
      std::
      _Rb_tree<wire::string,_wire::string,_std::_Identity<wire::string>,_std::less<wire::string>,_std::allocator<wire::string>_>
      ::_M_insert_unique<wire::string>(&local_c8->_M_t,(string *)local_78);
      std::__cxx11::string::~string(local_78);
      pugi::xml_named_node_iterator::operator++(&local_d8);
    }
    pugi::xml_named_node_iterator::operator++(&local_a8);
  }
  pugi::xml_node::children(&local_58,&local_80,"remove");
  local_a8._node._root = local_58._begin._node._root;
  local_a8._name = local_58._begin._name;
  local_98._node._root = local_58._end._node._root;
  local_98._name = local_58._end._name;
  __rhs = &local_88->profile;
  while( true ) {
    bVar1 = pugi::xml_named_node_iterator::operator!=(&local_a8,&local_98);
    if (!bVar1) break;
    pxVar2 = pugi::xml_named_node_iterator::operator*(&local_a8);
    local_b0._root = pxVar2->_root;
    local_108._begin._node._root = (xml_node_struct *)pugi::xml_node::attribute(&local_b0,"profile")
    ;
    pcVar3 = pugi::xml_attribute::value((xml_attribute *)&local_108);
    bVar1 = std::operator==(pcVar3,&__rhs->super_string);
    if (bVar1) {
      local_110._root = local_b0._root;
      pugi::xml_node::children(&local_108,&local_110,"type");
      local_d8._node._root = local_108._begin._node._root;
      local_d8._name = local_108._begin._name;
      local_e8._node._root = local_108._end._node._root;
      local_e8._name = local_108._end._name;
      while( true ) {
        bVar1 = pugi::xml_named_node_iterator::operator!=(&local_d8,&local_e8);
        if (!bVar1) break;
        pxVar2 = pugi::xml_named_node_iterator::operator*(&local_d8);
        local_120._root = pxVar2->_root;
        local_118 = pugi::xml_node::attribute(&local_120,"name");
        pcVar3 = pugi::xml_attribute::value(&local_118);
        wire::string::string((string *)local_78,pcVar3);
        std::
        _Rb_tree<wire::string,_wire::string,_std::_Identity<wire::string>,_std::less<wire::string>,_std::allocator<wire::string>_>
        ::erase(&local_b8->_M_t,(key_type *)local_78);
        std::__cxx11::string::~string(local_78);
        pugi::xml_named_node_iterator::operator++(&local_d8);
      }
      pugi::xml_node::children(&local_108,&local_110,"enum");
      local_d8._node._root = local_108._begin._node._root;
      local_d8._name = local_108._begin._name;
      local_e8._node._root = local_108._end._node._root;
      local_e8._name = local_108._end._name;
      while( true ) {
        bVar1 = pugi::xml_named_node_iterator::operator!=(&local_d8,&local_e8);
        if (!bVar1) break;
        pxVar2 = pugi::xml_named_node_iterator::operator*(&local_d8);
        local_120._root = pxVar2->_root;
        local_118 = pugi::xml_node::attribute(&local_120,"name");
        pcVar3 = pugi::xml_attribute::value(&local_118);
        wire::string::string((string *)local_78,pcVar3);
        std::
        _Rb_tree<wire::string,_wire::string,_std::_Identity<wire::string>,_std::less<wire::string>,_std::allocator<wire::string>_>
        ::erase(&local_c0->_M_t,(key_type *)local_78);
        std::__cxx11::string::~string(local_78);
        pugi::xml_named_node_iterator::operator++(&local_d8);
      }
      pugi::xml_node::children(&local_108,&local_110,"command");
      local_d8._node._root = local_108._begin._node._root;
      local_d8._name = local_108._begin._name;
      local_e8._node._root = local_108._end._node._root;
      local_e8._name = local_108._end._name;
      while( true ) {
        bVar1 = pugi::xml_named_node_iterator::operator!=(&local_d8,&local_e8);
        if (!bVar1) break;
        pxVar2 = pugi::xml_named_node_iterator::operator*(&local_d8);
        local_120._root = pxVar2->_root;
        local_118 = pugi::xml_node::attribute(&local_120,"name");
        pcVar3 = pugi::xml_attribute::value(&local_118);
        wire::string::string((string *)local_78,pcVar3);
        std::
        _Rb_tree<wire::string,_wire::string,_std::_Identity<wire::string>,_std::less<wire::string>,_std::allocator<wire::string>_>
        ::erase(&local_c8->_M_t,(key_type *)local_78);
        std::__cxx11::string::~string(local_78);
        pugi::xml_named_node_iterator::operator++(&local_d8);
      }
    }
    pugi::xml_named_node_iterator::operator++(&local_a8);
  }
  return;
}

Assistant:

void update_manifest(Manifest& manifest,
                     const Target& target,
                     const pugi::xml_node node)
{
  for (const pugi::xml_node rn : node.children("require"))
    add_to_manifest(manifest, rn);

  // Apply <remove> tags for the selected profile
  for (const pugi::xml_node rn : node.children("remove"))
  {
    if (rn.attribute("profile").value() == target.profile)
      remove_from_manifest(manifest, rn);
  }
}